

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_shared_object.hpp
# Opt level: O2

void __thiscall
boost::detail::
sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
::dispose(sp_counted_impl_pd<std::basic_ofstream<char,_std::char_traits<char>_>_*,_boost::detail::sp_ms_deleter<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          *this)

{
  if ((this->del).initialized_ == true) {
    (*(code *)**(undefined8 **)&(this->del).storage_)(&(this->del).storage_);
    (this->del).initialized_ = false;
  }
  return;
}

Assistant:

void destroy() BOOST_SP_NOEXCEPT
    {
        if( initialized_ )
        {
#if defined( __GNUC__ )

            // fixes incorrect aliasing warning
            T * p = reinterpret_cast< T* >( storage_.data_ );
            p->~T();

#else

            reinterpret_cast< T* >( storage_.data_ )->~T();

#endif

            initialized_ = false;
        }
    }